

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
AddExtension(DescriptorIndex<std::pair<const_void_*,_int>_> *this,FieldDescriptorProto *field,
            pair<const_void_*,_int> value)

{
  string *psVar1;
  bool bVar2;
  LogMessage *pLVar3;
  bool bVar4;
  int **local_88;
  char *local_80;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  pair<const_void_*,_int> value_local;
  undefined1 local_58 [32];
  int32 local_38;
  
  value_local.first = value.first;
  value_local.second = value.second;
  psVar1 = (field->extendee_).ptr_;
  bVar4 = true;
  if ((psVar1->_M_string_length != 0) && (*(psVar1->_M_dataplus)._M_p == '.')) {
    std::__cxx11::string::substr((ulong)&local_88,(ulong)psVar1);
    local_58._8_8_ = local_80;
    local_38 = field->number_;
    local_58._0_8_ = local_58 + 0x10;
    if (local_88 == (int **)local_78) {
      local_58._24_8_ = uStack_70;
    }
    else {
      local_58._0_8_ = local_88;
    }
    local_80 = (char *)0x0;
    local_78[0] = 0;
    local_88 = (int **)local_78;
    bVar2 = InsertIfNotPresent<std::map<std::pair<std::__cxx11::string,int>,std::pair<void_const*,int>,std::less<std::pair<std::__cxx11::string,int>>,std::allocator<std::pair<std::pair<std::__cxx11::string,int>const,std::pair<void_const*,int>>>>>
                      (&this->by_extension_,(first_type *)local_58,&value_local);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)&local_88);
    if (!bVar2) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_58,LOGLEVEL_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor_database.cc"
                 ,0xa2);
      pLVar3 = internal::LogMessage::operator<<
                         ((LogMessage *)local_58,
                          "Extension conflicts with extension already in database: extend ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(field->extendee_).ptr_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," { ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,(field->name_).ptr_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," = ");
      pLVar3 = internal::LogMessage::operator<<(pLVar3,field->number_);
      pLVar3 = internal::LogMessage::operator<<(pLVar3," }");
      internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar3);
      internal::LogMessage::~LogMessage((LogMessage *)local_58);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool SimpleDescriptorDatabase::DescriptorIndex<Value>::AddExtension(
    const FieldDescriptorProto& field,
    Value value) {
  if (!field.extendee().empty() && field.extendee()[0] == '.') {
    // The extension is fully-qualified.  We can use it as a lookup key in
    // the by_symbol_ table.
    if (!InsertIfNotPresent(
            &by_extension_,
            std::make_pair(field.extendee().substr(1), field.number()),
            value)) {
      GOOGLE_LOG(ERROR) << "Extension conflicts with extension already in database: "
                    "extend " << field.extendee() << " { "
                 << field.name() << " = " << field.number() << " }";
      return false;
    }
  } else {
    // Not fully-qualified.  We can't really do anything here, unfortunately.
    // We don't consider this an error, though, because the descriptor is
    // valid.
  }
  return true;
}